

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall
discordpp::ApplicationCommandOption::ApplicationCommandOption
          (ApplicationCommandOption *this,field<discordpp::ApplicationCommandOptionType> *type,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *name_localizations,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          nullable_omittable_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *description_localizations,omittable_field<bool> *required,
          omittable_field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
          *choices,omittable_field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
                   *options,
          omittable_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
          *channel_types,omittable_field<std::variant<int,_double>_> *min_value,
          omittable_field<std::variant<int,_double>_> *max_value,omittable_field<int> *min_length,
          omittable_field<int> *max_length,omittable_field<bool> *autocomplete)

{
  _Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_std::variant<int,_double>_*,_false> _Var3;
  _Head_base<0UL,_int_*,_false> _Var4;
  undefined8 uVar5;
  _Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false> _Var6;
  _Head_base<0UL,_bool_*,_false> _Var7;
  _Head_base<0UL,_std::variant<int,_double>_*,_false> _Var8;
  _Head_base<0UL,_int_*,_false> _Var9;
  pointer *__ptr_1;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (type->t_)._M_t.
       super___uniq_ptr_impl<discordpp::ApplicationCommandOptionType,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::ApplicationCommandOptionType_*,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
       .super__Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (ApplicationCommandOptionType *)0x0) {
    (this->type).t_._M_t.
    super___uniq_ptr_impl<discordpp::ApplicationCommandOptionType,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::ApplicationCommandOptionType_*,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
    .super__Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false> =
         (_Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false>)0x0;
    _Var6._M_head_impl = (ApplicationCommandOptionType *)0x0;
  }
  else {
    _Var6._M_head_impl = (ApplicationCommandOptionType *)operator_new(4);
    *_Var6._M_head_impl = *_Var1._M_head_impl;
  }
  (this->type).t_._M_t.
  super___uniq_ptr_impl<discordpp::ApplicationCommandOptionType,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::ApplicationCommandOptionType_*,_std::default_delete<discordpp::ApplicationCommandOptionType>_>
  .super__Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false> =
       (_Head_base<0UL,_discordpp::ApplicationCommandOptionType_*,_false>)_Var6._M_head_impl;
  (this->type).s_ = type->s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,name);
  field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::field(&(this->name_localizations).
           super_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ,&name_localizations->
            super_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         );
  (this->name_localizations)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__00250450;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->description,description);
  field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::field(&(this->description_localizations).
           super_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ,&description_localizations->
            super_field<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         );
  (this->description_localizations)._vptr_nullable_omittable_field =
       (_func_int **)&PTR_operator__00250450;
  _Var2._M_head_impl =
       (required->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>
       ._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->required).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var7._M_head_impl = (bool *)0x0;
  }
  else {
    _Var7._M_head_impl = (bool *)operator_new(1);
    *_Var7._M_head_impl = *_Var2._M_head_impl;
  }
  (this->required).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>
  ._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var7._M_head_impl;
  (this->required).super_field<bool>.s_ = (required->super_field<bool>).s_;
  (this->required)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
  ::field(&(this->choices).
           super_field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
          ,&choices->
            super_field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
         );
  (this->choices)._vptr_omittable_field = (_func_int **)&PTR_operator__002504b0;
  field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
  ::field(&(this->options).
           super_field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
          ,&options->
            super_field<std::vector<discordpp::ApplicationCommandOption,_std::allocator<discordpp::ApplicationCommandOption>_>_>
         );
  (this->options)._vptr_omittable_field = (_func_int **)&PTR_operator__00250530;
  field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::field
            (&(this->channel_types).
              super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
             ,&channel_types->
               super_field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>
            );
  (this->channel_types)._vptr_omittable_field = (_func_int **)&PTR_operator__00250580;
  _Var3._M_head_impl =
       (min_value->super_field<std::variant<int,_double>_>).t_._M_t.
       super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
       .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (variant<int,_double> *)0x0) {
    (this->min_value).super_field<std::variant<int,_double>_>.t_._M_t.
    super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
    .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl =
         (variant<int,_double> *)0x0;
    _Var8._M_head_impl = (variant<int,_double> *)0x0;
  }
  else {
    _Var8._M_head_impl = (variant<int,_double> *)operator_new(0x10);
    uVar5 = *(undefined8 *)((long)&(_Var3._M_head_impl)->super__Variant_base<int,_double> + 8);
    *(undefined8 *)
     &((_Var8._M_head_impl)->super__Variant_base<int,_double>).super__Move_assign_alias<int,_double>
         = *(undefined8 *)&(_Var3._M_head_impl)->super__Variant_base<int,_double>;
    *(undefined8 *)
     ((long)&((_Var8._M_head_impl)->super__Variant_base<int,_double>).
             super__Move_assign_alias<int,_double> + 8) = uVar5;
  }
  (this->min_value).super_field<std::variant<int,_double>_>.t_._M_t.
  super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
  .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl = _Var8._M_head_impl;
  (this->min_value).super_field<std::variant<int,_double>_>.s_ =
       (min_value->super_field<std::variant<int,_double>_>).s_;
  (this->min_value)._vptr_omittable_field = (_func_int **)&PTR_operator__002505d0;
  _Var3._M_head_impl =
       (max_value->super_field<std::variant<int,_double>_>).t_._M_t.
       super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
       .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (variant<int,_double> *)0x0) {
    (this->max_value).super_field<std::variant<int,_double>_>.t_._M_t.
    super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
    .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl =
         (variant<int,_double> *)0x0;
    _Var8._M_head_impl = (variant<int,_double> *)0x0;
  }
  else {
    _Var8._M_head_impl = (variant<int,_double> *)operator_new(0x10);
    uVar5 = *(undefined8 *)((long)&(_Var3._M_head_impl)->super__Variant_base<int,_double> + 8);
    *(undefined8 *)
     &((_Var8._M_head_impl)->super__Variant_base<int,_double>).super__Move_assign_alias<int,_double>
         = *(undefined8 *)&(_Var3._M_head_impl)->super__Variant_base<int,_double>;
    *(undefined8 *)
     ((long)&((_Var8._M_head_impl)->super__Variant_base<int,_double>).
             super__Move_assign_alias<int,_double> + 8) = uVar5;
  }
  (this->max_value).super_field<std::variant<int,_double>_>.t_._M_t.
  super___uniq_ptr_impl<std::variant<int,_double>,_std::default_delete<std::variant<int,_double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::variant<int,_double>_*,_std::default_delete<std::variant<int,_double>_>_>
  .super__Head_base<0UL,_std::variant<int,_double>_*,_false>._M_head_impl = _Var8._M_head_impl;
  (this->max_value).super_field<std::variant<int,_double>_>.s_ =
       (max_value->super_field<std::variant<int,_double>_>).s_;
  (this->max_value)._vptr_omittable_field = (_func_int **)&PTR_operator__002505d0;
  _Var4._M_head_impl =
       (min_length->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (int *)0x0) {
    (this->min_length).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var9._M_head_impl = (int *)0x0;
  }
  else {
    _Var9._M_head_impl = (int *)operator_new(4);
    *_Var9._M_head_impl = *_Var4._M_head_impl;
  }
  (this->min_length).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var9._M_head_impl;
  (this->min_length).super_field<int>.s_ = (min_length->super_field<int>).s_;
  (this->min_length)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var4._M_head_impl =
       (max_length->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (int *)0x0) {
    (this->max_length).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var9._M_head_impl = (int *)0x0;
  }
  else {
    _Var9._M_head_impl = (int *)operator_new(4);
    *_Var9._M_head_impl = *_Var4._M_head_impl;
  }
  (this->max_length).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var9._M_head_impl;
  (this->max_length).super_field<int>.s_ = (max_length->super_field<int>).s_;
  (this->max_length)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (autocomplete->super_field<bool>).t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->autocomplete).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var7._M_head_impl = (bool *)0x0;
  }
  else {
    _Var7._M_head_impl = (bool *)operator_new(1);
    *_Var7._M_head_impl = *_Var2._M_head_impl;
  }
  (this->autocomplete).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  (this->autocomplete).super_field<bool>.s_ = (autocomplete->super_field<bool>).s_;
  (this->autocomplete)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  return;
}

Assistant:

ApplicationCommandOption(
        field<ApplicationCommandOptionType> type = uninitialized,
        field<std::string> name = uninitialized,
        nullable_omittable_field<std::map<Locale, std::string>> name_localizations = omitted,
        field<std::string> description = uninitialized,
        nullable_omittable_field<std::map<Locale, std::string>> description_localizations = omitted,
        omittable_field<bool> required = omitted,
        omittable_field<std::vector<ApplicationCommandOptionChoice> > choices = omitted,
        omittable_field<std::vector<ApplicationCommandOption> > options = omitted,
        omittable_field<std::vector<ChannelType> > channel_types = omitted,
        omittable_field<std::variant<int, double>> min_value = omitted,
        omittable_field<std::variant<int, double>> max_value = omitted,
        omittable_field<int> min_length = omitted,
        omittable_field<int> max_length = omitted,
        omittable_field<bool> autocomplete = omitted
    ):
        type(type),
        name(name),
        name_localizations(name_localizations),
        description(description),
        description_localizations(description_localizations),
        required(required),
        choices(choices),
        options(options),
        channel_types(channel_types),
        min_value(min_value),
        max_value(max_value),
        min_length(min_length),
        max_length(max_length),
        autocomplete(autocomplete)
    {}